

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive_impl.h
# Opt level: O0

void test_exhaustive_schnorrsig_sign
               (secp256k1_context *ctx,uchar (*xonly_pubkey_bytes) [32],secp256k1_keypair *keypairs,
               int *parities)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  uint uVar3;
  long in_RSI;
  uchar expected_s_bytes [32];
  secp256k1_scalar expected_s;
  secp256k1_scalar e;
  int actual_k;
  uchar sig64 [64];
  uchar msg32 [32];
  int e_count_done;
  int e_done [13];
  int actual_d;
  secp256k1_schnorrsig_extraparams extraparams;
  uint64_t iter;
  int k;
  int d;
  secp256k1_scalar *in_stack_fffffffffffffed8;
  uchar *in_stack_fffffffffffffee0;
  secp256k1_schnorrsig_extraparams *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff00;
  uchar *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  secp256k1_context *in_stack_ffffffffffffff18;
  undefined1 auStack_d8 [56];
  uchar *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar4;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_scalar *in_stack_ffffffffffffff80;
  int local_4c;
  uint64_t local_30;
  int local_28;
  int local_24;
  long local_20;
  long local_10;
  
  local_30 = 0;
  local_24 = 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  do {
    if (0xc < local_24) {
      return;
    }
    local_4c = local_24;
    if (*(int *)(local_20 + (long)(local_24 + -1) * 4) != 0) {
      local_4c = 0xd - local_24;
    }
    for (local_28 = 1; local_28 < 0xd; local_28 = local_28 + 1) {
      memset(&stack0xffffffffffffff78,0,0x34);
      iVar4 = 0;
      iVar2 = local_28;
      iVar1 = skip_section(&local_30);
      if (iVar1 == 0) {
        if (*(int *)(local_20 + (long)(local_28 + -1) * 4) != 0) {
          iVar2 = 0xd - local_28;
        }
        while (iVar4 < 0xd) {
          secp256k1_testrand256(in_stack_fffffffffffffee0);
          secp256k1_schnorrsig_challenge
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60);
          if (*(int *)(&stack0xffffffffffffff78 + (ulong)in_stack_ffffffffffffff00 * 4) == 0) {
            uVar3 = (iVar2 + in_stack_ffffffffffffff00 * local_4c) % 0xd;
            secp256k1_scalar_get_b32(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            iVar1 = secp256k1_schnorrsig_sign_custom
                              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff08,CONCAT44(iVar2,in_stack_ffffffffffffff00),
                               (secp256k1_keypair *)CONCAT44(uVar3,in_stack_fffffffffffffef8),
                               in_stack_fffffffffffffef0);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                      ,0xac,
                      "test condition failed: secp256k1_schnorrsig_sign_custom(ctx, sig64, msg32, sizeof(msg32), &keypairs[d - 1], &extraparams)"
                     );
              abort();
            }
            iVar1 = secp256k1_memcmp_var
                              (&stack0xffffffffffffff08,
                               (void *)(local_10 + (long)(local_28 + -1) * 0x20),0x20);
            if (iVar1 != 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                      ,0xae,
                      "test condition failed: secp256k1_memcmp_var(sig64, xonly_pubkey_bytes[k - 1], 32) == 0"
                     );
              abort();
            }
            iVar1 = secp256k1_memcmp_var(auStack_d8,&stack0xfffffffffffffed8,0x20);
            if (iVar1 != 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                      ,0xb0,
                      "test condition failed: secp256k1_memcmp_var(sig64 + 32, expected_s_bytes, 32) == 0"
                     );
              abort();
            }
            *(undefined4 *)(&stack0xffffffffffffff78 + (ulong)in_stack_ffffffffffffff00 * 4) = 1;
            iVar4 = iVar4 + 1;
          }
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void test_exhaustive_schnorrsig_sign(const secp256k1_context *ctx, unsigned char (*xonly_pubkey_bytes)[32], const secp256k1_keypair* keypairs, const int* parities) {
    int d, k;
    uint64_t iter = 0;
    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;

    /* Loop over keys. */
    for (d = 1; d < EXHAUSTIVE_TEST_ORDER; ++d) {
        int actual_d = d;
        if (parities[d - 1]) actual_d = EXHAUSTIVE_TEST_ORDER - d;
        /* Loop over nonces. */
        for (k = 1; k < EXHAUSTIVE_TEST_ORDER; ++k) {
            int e_done[EXHAUSTIVE_TEST_ORDER] = {0};
            int e_count_done = 0;
            unsigned char msg32[32];
            unsigned char sig64[64];
            int actual_k = k;
            if (skip_section(&iter)) continue;
            extraparams.noncefp = secp256k1_hardened_nonce_function_smallint;
            extraparams.ndata = &k;
            if (parities[k - 1]) actual_k = EXHAUSTIVE_TEST_ORDER - k;
            /* Generate random messages until all challenges have been tried. */
            while (e_count_done < EXHAUSTIVE_TEST_ORDER) {
                secp256k1_scalar e;
                secp256k1_testrand256(msg32);
                secp256k1_schnorrsig_challenge(&e, xonly_pubkey_bytes[k - 1], msg32, sizeof(msg32), xonly_pubkey_bytes[d - 1]);
                /* Only do work if we hit a challenge we haven't tried before. */
                if (!e_done[e]) {
                    secp256k1_scalar expected_s = (actual_k + e * actual_d) % EXHAUSTIVE_TEST_ORDER;
                    unsigned char expected_s_bytes[32];
                    secp256k1_scalar_get_b32(expected_s_bytes, &expected_s);
                    /* Invoke the real function to construct a signature. */
                    CHECK(secp256k1_schnorrsig_sign_custom(ctx, sig64, msg32, sizeof(msg32), &keypairs[d - 1], &extraparams));
                    /* The first 32 bytes must match the xonly pubkey for the specified k. */
                    CHECK(secp256k1_memcmp_var(sig64, xonly_pubkey_bytes[k - 1], 32) == 0);
                    /* The last 32 bytes must match the expected s value. */
                    CHECK(secp256k1_memcmp_var(sig64 + 32, expected_s_bytes, 32) == 0);
                    /* Don't retry other messages that result in the same challenge. */
                    e_done[e] = 1;
                    ++e_count_done;
                }
            }
        }
    }
}